

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transport.cpp
# Opt level: O2

void __thiscall
adios2::Transport::Transport(Transport *this,string *type,string *library,Comm *comm)

{
  this->_vptr_Transport = (_func_int **)&PTR__Transport_008231d8;
  std::__cxx11::string::string((string *)&this->m_Type,(string *)type);
  std::__cxx11::string::string((string *)&this->m_Library,(string *)library);
  (this->m_Name)._M_dataplus._M_p = (pointer)&(this->m_Name).field_2;
  (this->m_Name)._M_string_length = 0;
  (this->m_Name).field_2._M_local_buf[0] = '\0';
  this->m_OpenMode = Undefined;
  this->m_IsOpen = false;
  this->m_Comm = comm;
  profiling::IOChrono::IOChrono(&this->m_Profiler);
  return;
}

Assistant:

Transport::Transport(const std::string type, const std::string library, helper::Comm const &comm)
: m_Type(type), m_Library(library), m_Comm(comm)
{
}